

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void fillBackground(QPainter *p,QRectF *rect,QBrush *brush,QPointF *origin,QRectF *gradientRect)

{
  long lVar1;
  bool bVar2;
  BrushStyle BVar3;
  QGradient *this;
  QTransform *in_RCX;
  QTransform *in_RDX;
  QPainter *in_RSI;
  QRectF *in_R8;
  long in_FS_OFFSET;
  QBrush *this_00;
  QTransform m;
  QPointF *in_stack_ffffffffffffff70;
  undefined1 local_58 [64];
  QPainter *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPainter::save(in_RSI);
  BVar3 = QBrush::style((QBrush *)0x7fa20a);
  if (((int)BVar3 < 0xf) || (BVar3 = QBrush::style((QBrush *)0x7fa21d), 0x11 < (int)BVar3)) {
    QPainter::setBrushOrigin((QPainter *)in_RDX,in_stack_ffffffffffffff70);
  }
  else {
    bVar2 = QRectF::isNull(in_R8);
    if (!bVar2) {
      memcpy(local_58,&DAT_00bd2650,0x50);
      QTransform::QTransform((QTransform *)in_stack_ffffffffffffff70);
      this_00 = (QBrush *)QRectF::left(in_R8);
      QRectF::top(in_R8);
      QTransform::translate(in_RCX,(qreal)in_R8,(qreal)in_RDX);
      QRectF::width(in_R8);
      QRectF::height(in_R8);
      QTransform::scale(in_RCX,(qreal)in_R8,(qreal)in_RDX);
      QBrush::setTransform((QBrush *)in_R8,in_RDX);
      this = QBrush::gradient(this_00);
      QGradient::setCoordinateMode(this,LogicalMode);
    }
  }
  QPainter::fillRect((QPainter *)in_RCX,in_R8,(QBrush *)in_RDX);
  QPainter::restore(in_stack_ffffffffffffffe8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fillBackground(QPainter *p, const QRectF &rect, QBrush brush, const QPointF &origin, const QRectF &gradientRect = QRectF())
{
    p->save();
    if (brush.style() >= Qt::LinearGradientPattern && brush.style() <= Qt::ConicalGradientPattern) {
        if (!gradientRect.isNull()) {
            QTransform m;
            m.translate(gradientRect.left(), gradientRect.top());
            m.scale(gradientRect.width(), gradientRect.height());
            brush.setTransform(m);
            const_cast<QGradient *>(brush.gradient())->setCoordinateMode(QGradient::LogicalMode);
        }
    } else {
        p->setBrushOrigin(origin);
    }
    p->fillRect(rect, brush);
    p->restore();
}